

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

void __thiscall
icu_63::numparse::impl::AffixMatcher::postProcess(AffixMatcher *this,ParsedNumber *result)

{
  AffixPatternMatcher *pAVar1;
  bool bVar2;
  UnicodeString local_68;
  
  bVar2 = anon_unknown.dwarf_1ff85a::matched(this->fPrefix,&result->prefix);
  if (bVar2) {
    bVar2 = anon_unknown.dwarf_1ff85a::matched(this->fSuffix,&result->suffix);
    if (bVar2) {
      if ((undefined1  [56])((undefined1  [56])(result->prefix).fUnion & (undefined1  [56])0x1) !=
          (undefined1  [56])0x0) {
        local_68.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003c0258;
        local_68.fUnion.fStackFields.fLengthAndFlags = 2;
        UnicodeString::moveFrom(&result->prefix,&local_68);
        UnicodeString::~UnicodeString(&local_68);
      }
      if ((undefined1  [56])((undefined1  [56])(result->suffix).fUnion & (undefined1  [56])0x1) !=
          (undefined1  [56])0x0) {
        local_68.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003c0258;
        local_68.fUnion.fStackFields.fLengthAndFlags = 2;
        UnicodeString::moveFrom(&result->suffix,&local_68);
        UnicodeString::~UnicodeString(&local_68);
      }
      result->flags = result->flags | this->fFlags;
      pAVar1 = this->fPrefix;
      if (pAVar1 != (AffixPatternMatcher *)0x0) {
        (*(pAVar1->super_ArraySeriesMatcher).super_SeriesMatcher.super_CompositionMatcher.
          super_NumberParseMatcher._vptr_NumberParseMatcher[5])(pAVar1,result);
      }
      pAVar1 = this->fSuffix;
      if (pAVar1 != (AffixPatternMatcher *)0x0) {
        (*(pAVar1->super_ArraySeriesMatcher).super_SeriesMatcher.super_CompositionMatcher.
          super_NumberParseMatcher._vptr_NumberParseMatcher[5])(pAVar1,result);
      }
    }
  }
  return;
}

Assistant:

void AffixMatcher::postProcess(ParsedNumber& result) const {
    // Check to see if our affix is the one that was matched. If so, set the flags in the result.
    if (matched(fPrefix, result.prefix) && matched(fSuffix, result.suffix)) {
        // Fill in the result prefix and suffix with non-null values (empty string).
        // Used by strict mode to determine whether an entire affix pair was matched.
        if (result.prefix.isBogus()) {
            result.prefix = UnicodeString();
        }
        if (result.suffix.isBogus()) {
            result.suffix = UnicodeString();
        }
        result.flags |= fFlags;
        if (fPrefix != nullptr) {
            fPrefix->postProcess(result);
        }
        if (fSuffix != nullptr) {
            fSuffix->postProcess(result);
        }
    }
}